

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

void __thiscall Server::Server(Server *this,string *ip,int port,string *password)

{
  io_service *this_00;
  pointer pcVar1;
  char *str;
  error_code local_a0;
  address local_90;
  undefined **local_70 [3];
  error_category *local_58;
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  (this->_password)._M_dataplus._M_p = (pointer)&(this->_password).field_2;
  pcVar1 = (password->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + password->_M_string_length);
  this_00 = &this->_io_service;
  boost::asio::io_context::io_context(this_00);
  str = (ip->_M_dataplus)._M_p;
  boost::system::error_code::error_code(&local_a0);
  boost::asio::ip::make_address(&local_90,str,&local_a0);
  if (local_a0.failed_ != true) {
    boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint
              (&this->_endpoint,&local_90,(unsigned_short)port);
    boost::asio::
    basic_socket_acceptor<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
    ::basic_socket_acceptor<boost::asio::io_context>
              (&this->_acceptor,this_00,&this->_endpoint,true,(type *)0x0);
    boost::asio::detail::
    io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
    ::io_object_impl<boost::asio::io_context>
              ((io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                *)&this->_socket,this_00,(type *)0x0);
    return;
  }
  std::runtime_error::runtime_error((runtime_error *)local_70,"");
  local_50._M_p = (pointer)((long)&((system_error *)local_70)->m_what + 0x10);
  local_70[0] = &PTR__system_error_0016c078;
  local_58 = local_a0.cat_;
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  boost::throw_exception<boost::system::system_error>((system_error *)local_70);
}

Assistant:

Server::Server(const std::string& ip, int port, const std::string& password) :
    _password(password),
    _endpoint(boost::asio::ip::address::from_string(ip), port),
    _acceptor(_io_service, _endpoint),
    _socket(_io_service) {
}